

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  int *in_RSI;
  int *in_RDI;
  
  secp256k1_scalar_verify((secp256k1_scalar *)0x103468);
  if (*in_RSI == 0) {
    *in_RDI = 0;
  }
  else {
    *in_RDI = 0xd - *in_RSI;
  }
  secp256k1_scalar_verify((secp256k1_scalar *)0x10349c);
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    SECP256K1_SCALAR_VERIFY(a);

    if (*a == 0) {
        *r = 0;
    } else {
        *r = EXHAUSTIVE_TEST_ORDER - *a;
    }

    SECP256K1_SCALAR_VERIFY(r);
}